

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int arbsvn_commit(igsc_device_handle *handle)

{
  uint uVar1;
  long in_FS_OFFSET;
  uint local_28;
  uint retries;
  int ret;
  igsc_device_handle *handle_local;
  long lStack_10;
  uint8_t fw_error;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  handle_local._7_1_ = 0;
  local_28 = 0;
  do {
    uVar1 = igsc_device_commit_arb_svn(handle,(long)&handle_local + 7);
    if (uVar1 != 0xd) break;
    gsc_msleep(2000);
    local_28 = local_28 + 1;
  } while (local_28 < 3);
  if (uVar1 == 0) {
    printf("ARB SVN Commit succeeded\n");
  }
  else if ((quiet & 1U) == 0) {
    fprintf(_stderr,"Error: ARB SVN Commit failed with return value %d, firmware error is %u\n",
            (ulong)uVar1,(ulong)handle_local._7_1_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

mockable_static
int arbsvn_commit(struct igsc_device_handle *handle)
{
    int ret;
    uint8_t fw_error = 0;
    unsigned int retries = 0;

    while ((ret = igsc_device_commit_arb_svn(handle, &fw_error)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }

    if (ret == IGSC_SUCCESS)
    {
       printf("ARB SVN Commit succeeded\n");
    }
    else
    {
       fwupd_error("ARB SVN Commit failed with return value %d, firmware error is %u\n",
                   ret, fw_error);
    }
    return ret;
}